

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow(bool *p_open)

{
  ImGuiWindow *window_00;
  int iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  ImGuiPopupData *pIVar6;
  ImGuiSettingsHandler *pIVar7;
  ImGuiWindow **ppIVar8;
  ImDrawList *text_begin;
  char *pcVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  ImRect IVar13;
  char *in_stack_000000b0;
  ImDrawList *in_stack_000000b8;
  ImGuiWindow *in_stack_000000c0;
  float font_size;
  char buf [32];
  ImRect r_1;
  ImDrawList *draw_list;
  ImGuiWindow *window_1;
  int n_2;
  char *input_source_names [5];
  ImGuiWindowSettings *settings;
  int n_1;
  int n;
  ImGuiWindow *window;
  int i_1;
  int i;
  ImRect r;
  int rect_n;
  char *trt_rects_names [11];
  char *wrt_rects_names [7];
  ImGuiMetricsConfig *cfg;
  ImGuiIO *io;
  ImGuiContext *g;
  ImVec2 *in_stack_fffffffffffffda8;
  ImPool<ImGuiTabBar> *in_stack_fffffffffffffdb0;
  ImVec2 *this;
  ImDrawList *in_stack_fffffffffffffdb8;
  ImGuiWindow *in_stack_fffffffffffffdc0;
  ImVec2 *in_stack_fffffffffffffdc8;
  ImDrawList *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  char *in_stack_fffffffffffffde0;
  char *local_218;
  void *in_stack_fffffffffffffdf0;
  char *local_208;
  float in_stack_fffffffffffffe30;
  uint in_stack_fffffffffffffe34;
  char *in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  uint in_stack_fffffffffffffe44;
  ImVec2 *in_stack_fffffffffffffe48;
  ImDrawList *in_stack_fffffffffffffe50;
  int local_12c;
  undefined8 local_128;
  bool *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  ImVec2 local_100;
  ImGuiWindowSettings *local_f8;
  int local_f0;
  int local_ec;
  ImGuiWindow *local_e8;
  int local_dc;
  int local_d8;
  float local_d4;
  float fStack_d0;
  float local_cc;
  float in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  ImVec2 in_stack_ffffffffffffff40;
  undefined1 local_b8 [96];
  undefined8 local_58 [7];
  ImGuiMetricsConfig *local_20;
  ImGuiIO *local_18;
  ImGuiContext *local_10;
  
  bVar2 = Begin((char *)window,_n_1,settings._4_4_);
  if (bVar2) {
    local_10 = GImGui;
    local_18 = &GImGui->IO;
    local_20 = &GImGui->DebugMetricsConfig;
    pcVar5 = GetVersion();
    Text("Dear ImGui %s",pcVar5);
    Text((char *)(double)(1000.0 / local_18->Framerate),
         "Application average %.3f ms/frame (%.1f FPS)");
    Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)local_18->MetricsRenderVertices,
         (ulong)(uint)local_18->MetricsRenderIndices,
         (long)local_18->MetricsRenderIndices / 3 & 0xffffffff);
    Text("%d active windows (%d visible)",(ulong)(uint)local_18->MetricsActiveWindows,
         (ulong)(uint)local_18->MetricsRenderWindows);
    Text("%d active allocations",(ulong)(uint)local_18->MetricsActiveAllocations);
    Separator();
    memcpy(local_58,&PTR_anon_var_dwarf_90d0_001de740,0x38);
    memcpy(local_b8,&PTR_anon_var_dwarf_90d0_001de780,0x58);
    if (local_20->ShowWindowsRectsType < 0) {
      local_20->ShowWindowsRectsType = 4;
    }
    if (local_20->ShowTablesRectsType < 0) {
      local_20->ShowTablesRectsType = 1;
    }
    bVar2 = TreeNode((char *)in_stack_fffffffffffffda8);
    if (bVar2) {
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff40,0.0,0.0);
      bVar2 = Button((char *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      if (bVar2) {
        DebugStartItemPicker();
      }
      SameLine((float)((ulong)in_stack_fffffffffffffdb0 >> 0x20),SUB84(in_stack_fffffffffffffdb0,0))
      ;
      MetricsHelpMarker((char *)0x14615d);
      Checkbox(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      Checkbox(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      SameLine((float)((ulong)in_stack_fffffffffffffdb0 >> 0x20),SUB84(in_stack_fffffffffffffdb0,0))
      ;
      fVar11 = GetFontSize();
      SetNextItemWidth(fVar11 * 12.0);
      bVar2 = Combo((char *)in_stack_fffffffffffffdc0,(int *)in_stack_fffffffffffffdb8,
                    (char **)in_stack_fffffffffffffdb0,
                    (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),(int)in_stack_fffffffffffffda8);
      local_20->ShowWindowsRects = (local_20->ShowWindowsRects & 1U) != 0 || bVar2;
      if (((local_20->ShowWindowsRects & 1U) != 0) && (local_10->NavWindow != (ImGuiWindow *)0x0)) {
        BulletText("\'%s\':",local_10->NavWindow->Name);
        Indent((float)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
        for (in_stack_ffffffffffffff3c = 0; in_stack_ffffffffffffff3c < 7;
            in_stack_ffffffffffffff3c = in_stack_ffffffffffffff3c + 1) {
          IVar13 = ShowMetricsWindow::Funcs::GetWindowRect
                             (in_stack_fffffffffffffdc0,
                              (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
          local_d4 = IVar13.Min.x;
          fStack_d0 = IVar13.Min.y;
          local_cc = IVar13.Max.x;
          in_stack_ffffffffffffff38 = IVar13.Max.y;
          pcVar5 = (char *)(double)local_d4;
          in_stack_fffffffffffffe48 = (ImVec2 *)(double)fStack_d0;
          in_stack_fffffffffffffe50 = (ImDrawList *)(double)local_cc;
          dVar12 = (double)in_stack_ffffffffffffff38;
          fVar11 = ImRect::GetWidth((ImRect *)&local_d4);
          fVar10 = ImRect::GetHeight((ImRect *)&local_d4);
          Text(pcVar5,in_stack_fffffffffffffe48,in_stack_fffffffffffffe50,dVar12,(double)fVar11,
               (double)fVar10,"(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",
               local_58[in_stack_ffffffffffffff3c]);
        }
        Unindent((float)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
      }
      Checkbox(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      Checkbox(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
      TreePop();
    }
    DebugNodeWindowsList
              ((ImVector<ImGuiWindow_*> *)in_stack_fffffffffffffdb0,
               (char *)in_stack_fffffffffffffda8);
    bVar2 = TreeNode("DrawLists","Active DrawLists (%d)",
                     (ulong)(uint)(local_10->DrawDataBuilder).Layers[0].Size);
    if (bVar2) {
      for (local_d8 = 0; local_d8 < (local_10->DrawDataBuilder).Layers[0].Size;
          local_d8 = local_d8 + 1) {
        ImVector<ImDrawList_*>::operator[]((local_10->DrawDataBuilder).Layers,local_d8);
        DebugNodeDrawList(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
      }
      TreePop();
    }
    bVar2 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(local_10->OpenPopupStack).Size);
    if (bVar2) {
      for (local_dc = 0; local_dc < (local_10->OpenPopupStack).Size; local_dc = local_dc + 1) {
        pIVar6 = ImVector<ImGuiPopupData>::operator[](&local_10->OpenPopupStack,local_dc);
        local_e8 = pIVar6->Window;
        pIVar6 = ImVector<ImGuiPopupData>::operator[](&local_10->OpenPopupStack,local_dc);
        in_stack_fffffffffffffe44 = pIVar6->PopupId;
        if (local_e8 == (ImGuiWindow *)0x0) {
          in_stack_fffffffffffffe38 = "NULL";
        }
        else {
          in_stack_fffffffffffffe38 = local_e8->Name;
        }
        uVar3 = in_stack_fffffffffffffe34 & 0xffffff;
        if (local_e8 != (ImGuiWindow *)0x0) {
          uVar3 = CONCAT13((local_e8->Flags & 0x1000000U) != 0,(int3)in_stack_fffffffffffffe34);
        }
        in_stack_fffffffffffffe34 = uVar3;
        pcVar5 = "";
        if ((char)(in_stack_fffffffffffffe34 >> 0x18) != '\0') {
          pcVar5 = " ChildWindow";
        }
        bVar2 = false;
        if (local_e8 != (ImGuiWindow *)0x0) {
          bVar2 = (local_e8->Flags & 0x10000000U) != 0;
        }
        pcVar9 = "";
        if (bVar2) {
          pcVar9 = " ChildMenu";
        }
        BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)in_stack_fffffffffffffe44,
                   in_stack_fffffffffffffe38,pcVar5,pcVar9);
      }
      TreePop();
    }
    uVar3 = ImPool<ImGuiTabBar>::GetSize(&local_10->TabBars);
    bVar2 = TreeNode("TabBars","Tab Bars (%d)",(ulong)uVar3);
    if (bVar2) {
      for (local_ec = 0; iVar1 = local_ec, iVar4 = ImPool<ImGuiTabBar>::GetSize(&local_10->TabBars),
          iVar1 < iVar4; local_ec = local_ec + 1) {
        ImPool<ImGuiTabBar>::GetByIndex
                  (in_stack_fffffffffffffdb0,(ImPoolIdx)((ulong)in_stack_fffffffffffffda8 >> 0x20));
        DebugNodeTabBar((ImGuiTabBar *)in_stack_ffffffffffffff40,
                        (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      }
      TreePop();
    }
    bVar2 = TreeNode((char *)in_stack_fffffffffffffda8);
    if (bVar2) {
      bVar2 = SmallButton((char *)in_stack_fffffffffffffdc0);
      if (bVar2) {
        ClearIniSettings();
      }
      SameLine((float)((ulong)in_stack_fffffffffffffdb0 >> 0x20),SUB84(in_stack_fffffffffffffdb0,0))
      ;
      bVar2 = SmallButton((char *)in_stack_fffffffffffffdc0);
      if (bVar2) {
        SaveIniSettingsToMemory((size_t *)in_stack_fffffffffffffdc0);
      }
      SameLine((float)((ulong)in_stack_fffffffffffffdb0 >> 0x20),SUB84(in_stack_fffffffffffffdb0,0))
      ;
      bVar2 = SmallButton((char *)in_stack_fffffffffffffdc0);
      if (bVar2) {
        SaveIniSettingsToDisk((char *)in_stack_fffffffffffffdc0);
      }
      SameLine((float)((ulong)in_stack_fffffffffffffdb0 >> 0x20),SUB84(in_stack_fffffffffffffdb0,0))
      ;
      if ((local_10->IO).IniFilename == (char *)0x0) {
        TextUnformatted((char *)in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
      }
      else {
        Text("\"%s\"",(local_10->IO).IniFilename);
      }
      Text((char *)(double)local_10->SettingsDirtyTimer,"SettingsDirtyTimer %.2f");
      bVar2 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                       (ulong)(uint)(local_10->SettingsHandlers).Size);
      if (bVar2) {
        for (local_f0 = 0; local_f0 < (local_10->SettingsHandlers).Size; local_f0 = local_f0 + 1) {
          pIVar7 = ImVector<ImGuiSettingsHandler>::operator[](&local_10->SettingsHandlers,local_f0);
          BulletText("%s",pIVar7->TypeName);
        }
        TreePop();
      }
      uVar3 = ImChunkStream<ImGuiWindowSettings>::size(&local_10->SettingsWindows);
      bVar2 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",(ulong)uVar3);
      if (bVar2) {
        local_f8 = ImChunkStream<ImGuiWindowSettings>::begin(&local_10->SettingsWindows);
        while (local_f8 != (ImGuiWindowSettings *)0x0) {
          DebugNodeWindowSettings((ImGuiWindowSettings *)in_stack_fffffffffffffdc0);
          local_f8 = ImChunkStream<ImGuiWindowSettings>::next_chunk
                               ((ImChunkStream<ImGuiWindowSettings> *)in_stack_fffffffffffffdc8,
                                (ImGuiWindowSettings *)in_stack_fffffffffffffdc0);
        }
        TreePop();
      }
      uVar3 = ImGuiTextBuffer::size(&local_10->SettingsIniData);
      bVar2 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",(ulong)uVar3);
      if (bVar2) {
        ImGuiTextBuffer::c_str(&local_10->SettingsIniData);
        fVar11 = GetTextLineHeight();
        ImVec2::ImVec2(&local_100,-1.1754944e-38,fVar11 * 20.0);
        in_stack_fffffffffffffda8 = (ImVec2 *)0x0;
        InputTextMultiline(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                           (size_t)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                           (ImGuiInputTextFlags)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
                           (ImGuiInputTextCallback)in_stack_fffffffffffffdb8,
                           in_stack_fffffffffffffdf0);
        TreePop();
      }
      TreePop();
    }
    bVar2 = TreeNode((char *)in_stack_fffffffffffffda8);
    if (bVar2) {
      memcpy(&local_128,&DAT_001de7e0,0x28);
      Text("WINDOWING");
      Indent((float)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
      if (local_10->HoveredWindow == (ImGuiWindow *)0x0) {
        local_208 = "NULL";
      }
      else {
        local_208 = local_10->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",local_208);
      if (local_10->HoveredRootWindow == (ImGuiWindow *)0x0) {
        pcVar5 = "NULL";
      }
      else {
        pcVar5 = local_10->HoveredRootWindow->Name;
      }
      Text("HoveredRootWindow: \'%s\'",pcVar5);
      if (local_10->HoveredWindowUnderMovingWindow == (ImGuiWindow *)0x0) {
        local_218 = "NULL";
      }
      else {
        local_218 = local_10->HoveredWindowUnderMovingWindow->Name;
      }
      Text("HoveredWindowUnderMovingWindow: \'%s\'",local_218);
      if (local_10->MovingWindow == (ImGuiWindow *)0x0) {
        pcVar5 = "NULL";
      }
      else {
        pcVar5 = local_10->MovingWindow->Name;
      }
      Text("MovingWindow: \'%s\'",pcVar5);
      Unindent((float)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
      Text("ITEMS");
      Indent((float)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
      Text((char *)(double)local_10->ActiveIdTimer,
           "ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
           (ulong)local_10->ActiveId,(ulong)local_10->ActiveIdPreviousFrame,
           (ulong)(local_10->ActiveIdAllowOverlap & 1),(&local_128)[local_10->ActiveIdSource]);
      if (local_10->ActiveIdWindow == (ImGuiWindow *)0x0) {
        pcVar5 = "NULL";
      }
      else {
        pcVar5 = local_10->ActiveIdWindow->Name;
      }
      Text("ActiveIdWindow: \'%s\'",pcVar5);
      Text((char *)(double)local_10->HoveredIdTimer,
           "HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",(ulong)local_10->HoveredId,
           (ulong)local_10->HoveredIdPreviousFrame,(ulong)(local_10->HoveredIdAllowOverlap & 1));
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
           (ulong)(local_10->DragDropActive & 1),(ulong)(local_10->DragDropPayload).SourceId,
           (local_10->DragDropPayload).DataType,(ulong)(uint)(local_10->DragDropPayload).DataSize);
      Unindent((float)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
      Text("NAV,FOCUS");
      Indent((float)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
      if (local_10->NavWindow == (ImGuiWindow *)0x0) {
        in_stack_fffffffffffffdd0 = (ImDrawList *)0x1c0618;
      }
      else {
        in_stack_fffffffffffffdd0 = (ImDrawList *)local_10->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",in_stack_fffffffffffffdd0);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)local_10->NavId,(ulong)local_10->NavLayer);
      Text("NavInputSource: %s",(&local_128)[local_10->NavInputSource]);
      Text("NavActive: %d, NavVisible: %d",(ulong)((local_10->IO).NavActive & 1),
           (ulong)((local_10->IO).NavVisible & 1));
      Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)local_10->NavActivateId,
           (ulong)local_10->NavInputId);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",
           (ulong)(local_10->NavDisableHighlight & 1),(ulong)(local_10->NavDisableMouseHover & 1));
      Text("NavFocusScopeId = 0x%08X",(ulong)local_10->NavFocusScopeId);
      if (local_10->NavWindowingTarget == (ImGuiWindow *)0x0) {
        in_stack_fffffffffffffdc8 = (ImVec2 *)0x1c0618;
      }
      else {
        in_stack_fffffffffffffdc8 = (ImVec2 *)local_10->NavWindowingTarget->Name;
      }
      Text("NavWindowingTarget: \'%s\'",in_stack_fffffffffffffdc8);
      Unindent((float)((ulong)in_stack_fffffffffffffdc0 >> 0x20));
      TreePop();
    }
    if (((local_20->ShowWindowsRects & 1U) != 0) || ((local_20->ShowWindowsBeginOrder & 1U) != 0)) {
      for (local_12c = 0; local_12c < (local_10->Windows).Size; local_12c = local_12c + 1) {
        ppIVar8 = ImVector<ImGuiWindow_*>::operator[](&local_10->Windows,local_12c);
        window_00 = *ppIVar8;
        if ((window_00->WasActive & 1U) != 0) {
          text_begin = GetForegroundDrawList(window_00);
          if ((local_20->ShowWindowsRects & 1U) != 0) {
            ShowMetricsWindow::Funcs::GetWindowRect
                      (in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
            ImDrawList::AddRect(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                                (ImVec2 *)
                                CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                                (ImU32)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                                SUB84(in_stack_fffffffffffffe38,0),in_stack_fffffffffffffe34,
                                in_stack_fffffffffffffe30);
          }
          if (((local_20->ShowWindowsBeginOrder & 1U) != 0) &&
             ((window_00->Flags & 0x1000000U) == 0)) {
            ImFormatString(&stack0xfffffffffffffe88,0x20,"%d",
                           (ulong)(uint)(int)window_00->BeginOrderWithinContext);
            fVar11 = GetFontSize();
            in_stack_fffffffffffffdc0 = (ImGuiWindow *)&window_00->Pos;
            this = (ImVec2 *)&stack0xfffffffffffffe74;
            ImVec2::ImVec2(this,fVar11,fVar11);
            operator+(in_stack_fffffffffffffda8,(ImVec2 *)0x146fec);
            ImDrawList::AddRectFilled
                      (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                       (ImVec2 *)in_stack_fffffffffffffdc0,(ImU32)((ulong)text_begin >> 0x20),
                       SUB84(text_begin,0),(ImDrawCornerFlags)((ulong)this >> 0x20));
            ImDrawList::AddText(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                                (ImU32)((ulong)in_stack_fffffffffffffdc0 >> 0x20),(char *)text_begin
                                ,(char *)this);
            in_stack_fffffffffffffdb8 = text_begin;
          }
        }
      }
    }
    End();
  }
  else {
    End();
  }
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!Begin("Dear ImGui Metrics/Debugger", p_open))
    {
        End();
        return;
    }

    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;

    // Basic info
    Text("Dear ImGui %s", ImGui::GetVersion());
    Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    Text("%d active allocations", io.MetricsActiveAllocations);
    //SameLine(); if (SmallButton("GC")) { g.GcCompactAll = true; }

    Separator();

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentRowsFrozen, TRT_ColumnsContentRowsUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentRowsFrozen", "ColumnsContentRowsUnfrozen" };
    if (cfg->ShowWindowsRectsType < 0)
        cfg->ShowWindowsRectsType = WRT_WorkRect;
    if (cfg->ShowTablesRectsType < 0)
        cfg->ShowTablesRectsType = TRT_WorkRect;

    struct Funcs
    {
        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)              { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }
    };

    // Tools
    if (TreeNode("Tools"))
    {
        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (Button("Item Picker.."))
            DebugStartItemPicker();
        SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        Checkbox("Show windows begin order", &cfg->ShowWindowsBeginOrder);
        Checkbox("Show windows rectangles", &cfg->ShowWindowsRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowWindowsRects |= Combo("##show_windows_rect_type", &cfg->ShowWindowsRectsType, wrt_rects_names, WRT_Count, WRT_Count);
        if (cfg->ShowWindowsRects && g.NavWindow != NULL)
        {
            BulletText("'%s':", g.NavWindow->Name);
            Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            Unindent();
        }
        Checkbox("Show ImDrawCmd mesh when hovering", &cfg->ShowDrawCmdMesh);
        Checkbox("Show ImDrawCmd bounding boxes when hovering", &cfg->ShowDrawCmdBoundingBoxes);
        TreePop();
    }

    // Contents
    DebugNodeWindowsList(&g.Windows, "Windows");
    //DebugNodeWindowList(&g.WindowsFocusOrder, "WindowsFocusOrder");
    if (TreeNode("DrawLists", "Active DrawLists (%d)", g.DrawDataBuilder.Layers[0].Size))
    {
        for (int i = 0; i < g.DrawDataBuilder.Layers[0].Size; i++)
            DebugNodeDrawList(NULL, g.DrawDataBuilder.Layers[0][i], "DrawList");
        TreePop();
    }

    // Details for Popups
    if (TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        TreePop();
    }

    // Details for TabBars
    if (TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetSize()))
    {
        for (int n = 0; n < g.TabBars.GetSize(); n++)
            DebugNodeTabBar(g.TabBars.GetByIndex(n), "TabBar");
        TreePop();
    }

    // Details for Tables
    IM_UNUSED(trt_rects_names);
#ifdef IMGUI_HAS_TABLE
    if (TreeNode("Tables", "Tables (%d)", g.Tables.GetSize()))
    {
        for (int n = 0; n < g.Tables.GetSize(); n++)
            DebugNodeTable(g.Tables.GetByIndex(n));
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_TABLE

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (TreeNode("Docking"))
    {
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (TreeNode("Settings"))
    {
        if (SmallButton("Clear"))
            ClearIniSettings();
        SameLine();
        if (SmallButton("Save to memory"))
            SaveIniSettingsToMemory();
        SameLine();
        if (SmallButton("Save to disk"))
            SaveIniSettingsToDisk(g.IO.IniFilename);
        SameLine();
        if (g.IO.IniFilename)
            Text("\"%s\"", g.IO.IniFilename);
        else
            TextUnformatted("<NULL>");
        Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                BulletText("%s", g.SettingsHandlers[n].TypeName);
            TreePop();
        }
        if (TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                DebugNodeWindowSettings(settings);
            TreePop();
        }

#ifdef IMGUI_HAS_TABLE
        if (TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                DebugNodeTableSettings(settings);
            TreePop();
        }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

        if (TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            InputTextMultiline("##Ini", (char*)(void*)g.SettingsIniData.c_str(), g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, GetTextLineHeight() * 20), ImGuiInputTextFlags_ReadOnly);
            TreePop();
        }
        TreePop();
    }

    // Misc Details
    if (TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Nav", "NavKeyboard", "NavGamepad" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);

        Text("WINDOWING");
        Indent();
        Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
        Text("HoveredWindowUnderMovingWindow: '%s'", g.HoveredWindowUnderMovingWindow ? g.HoveredWindowUnderMovingWindow->Name : "NULL");
        Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        Unindent();

        Text("ITEMS");
        Indent();
        Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        Unindent();

        Text("NAV,FOCUS");
        Indent();
        Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        Text("NavFocusScopeId = 0x%08X", g.NavFocusScopeId);
        Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        Unindent();

        TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (cfg->ShowWindowsRects || cfg->ShowWindowsBeginOrder)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (cfg->ShowWindowsRects)
            {
                ImRect r = Funcs::GetWindowRect(window, cfg->ShowWindowsRectsType);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (cfg->ShowWindowsBeginOrder && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

#ifdef IMGUI_HAS_TABLE
    // Overlay: Display Tables Rectangles
    if (show_tables_rects)
    {
        for (int table_n = 0; table_n < g.Tables.GetSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.GetByIndex(table_n);
        }
    }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl)
    {
    }
#endif // #ifdef IMGUI_HAS_DOCK

    End();
}